

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_binary_op.cxx
# Opt level: O0

void __thiscall HAXX_BINARY_OP::quaternion_binary_mul::test_method(quaternion_binary_mul *this)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double K;
  double J;
  double I;
  double S;
  double B4;
  double B3;
  double B2;
  double B1;
  double A4;
  double A3;
  double A2;
  double A1;
  quaternion<double> r;
  quaternion<double> p;
  quaternion<double> q;
  char *in_stack_fffffffffffff6b8;
  basic_cstring<const_char> *in_stack_fffffffffffff6c0;
  char *in_stack_fffffffffffff6c8;
  quaternion<double> *in_stack_fffffffffffff750;
  unsigned_long len;
  quaternion<double> *in_stack_fffffffffffff758;
  basic_cstring<const_char> local_670;
  basic_cstring<const_char> local_660;
  undefined1 local_650 [40];
  undefined1 local_628 [16];
  basic_cstring<const_char> local_618;
  double local_608;
  basic_cstring<const_char> local_600;
  basic_cstring<const_char> local_5f0;
  undefined1 local_5e0 [40];
  undefined1 local_5b8 [16];
  basic_cstring<const_char> local_5a8;
  double local_598;
  basic_cstring<const_char> local_590;
  basic_cstring<const_char> local_580;
  undefined1 local_570 [40];
  undefined1 local_548 [16];
  basic_cstring<const_char> local_538;
  double local_528;
  basic_cstring<const_char> local_520;
  basic_cstring<const_char> local_510;
  undefined1 local_500 [40];
  undefined1 local_4d8 [16];
  basic_cstring<const_char> local_4c8;
  double local_4b8;
  basic_cstring<const_char> local_4b0;
  basic_cstring<const_char> local_4a0;
  undefined1 local_490 [40];
  undefined1 local_468 [16];
  basic_cstring<const_char> local_458;
  double local_448;
  basic_cstring<const_char> local_440;
  basic_cstring<const_char> local_430;
  undefined1 local_420 [40];
  undefined1 local_3f8 [16];
  basic_cstring<const_char> local_3e8;
  double local_3d8;
  basic_cstring<const_char> local_3d0;
  basic_cstring<const_char> local_3c0;
  undefined1 local_3b0 [40];
  undefined1 local_388 [16];
  basic_cstring<const_char> local_378;
  double local_368;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  undefined1 local_340 [40];
  undefined1 local_318 [16];
  basic_cstring<const_char> local_308;
  double local_2f8;
  double local_2f0;
  basic_cstring<const_char> local_2e8;
  undefined1 local_2d8 [40];
  undefined1 local_2b0 [16];
  basic_cstring<const_char> local_2a0;
  double local_290;
  double local_288;
  basic_cstring<const_char> local_280;
  undefined1 local_270 [40];
  undefined1 local_248 [16];
  basic_cstring<const_char> local_238;
  double local_228;
  double local_220;
  basic_cstring<const_char> local_218;
  undefined1 local_208 [40];
  undefined1 local_1e0 [16];
  basic_cstring<const_char> local_1d0;
  double local_1c0;
  double local_1b8 [3];
  basic_cstring<const_char> local_1a0;
  undefined1 local_190 [40];
  undefined1 local_168 [16];
  basic_cstring<const_char> local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  quaternion<double> local_a8;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  quaternion<double> local_68;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  quaternion<double> local_28;
  
  local_30 = 1.0;
  local_38 = 2.0;
  local_40 = 3.0;
  local_48 = 4.0;
  HAXX::quaternion<double>::quaternion(&local_28,&local_30,&local_38,&local_40,&local_48);
  local_70 = -5.0;
  local_78 = 6.94;
  local_80 = 7.82;
  local_88 = -8.0;
  HAXX::quaternion<double>::quaternion(&local_68,&local_70,&local_78,&local_80,&local_88);
  local_b0 = 0.0;
  local_b8 = 0.0;
  local_c0 = 0.0;
  local_c8 = 0.0;
  HAXX::quaternion<double>::quaternion(&local_a8,&local_b0,&local_b8,&local_c0,&local_c8);
  HAXX::operator*(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
  local_a8._M_real = local_e8;
  local_a8._M_imag_i = local_e0;
  local_a8._M_imag_j = local_d8;
  local_a8._M_imag_k = local_d0;
  local_f0 = HAXX::quaternion<double>::real(&local_68);
  local_f8 = HAXX::quaternion<double>::imag_i(&local_68);
  local_100 = HAXX::quaternion<double>::imag_j(&local_68);
  local_108 = HAXX::quaternion<double>::imag_k(&local_68);
  local_110 = HAXX::quaternion<double>::real(&local_28);
  local_118 = HAXX::quaternion<double>::imag_i(&local_28);
  local_120 = HAXX::quaternion<double>::imag_j(&local_28);
  auVar5._0_8_ = HAXX::quaternion<double>::imag_k(&local_28);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_f0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_110;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = -(local_f8 * local_118);
  auVar3 = vfmadd213sd_fma(auVar15,auVar3,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_120;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = -local_100;
  auVar3 = vfmadd213sd_fma(auVar24,auVar4,auVar3);
  auVar5._8_8_ = 0;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = -local_108;
  auVar3 = vfmadd213sd_fma(auVar5,auVar16,auVar3);
  local_138._8_8_ = auVar3._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_f0;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_118;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_f8 * local_110;
  auVar3 = vfmadd213sd_fma(auVar17,auVar6,auVar25);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_100;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar5._0_8_;
  auVar3 = vfmadd213sd_fma(auVar26,auVar7,auVar3);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_120;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = -local_108;
  auVar3 = vfmadd213sd_fma(auVar8,auVar18,auVar3);
  local_138._0_8_ = auVar3._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_f0;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_120;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = -(local_f8 * auVar5._0_8_);
  auVar3 = vfmadd213sd_fma(auVar19,auVar9,auVar27);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_100;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_110;
  auVar3 = vfmadd213sd_fma(auVar28,auVar10,auVar3);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_108;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_118;
  auVar3 = vfmadd213sd_fma(auVar11,auVar20,auVar3);
  local_148._8_8_ = auVar3._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_f0;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar5._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_f8 * local_120;
  auVar3 = vfmadd213sd_fma(auVar21,auVar12,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_118;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = -local_100;
  auVar3 = vfmadd213sd_fma(auVar30,auVar13,auVar3);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_108;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_110;
  auVar3 = vfmadd213sd_fma(auVar14,auVar22,auVar3);
  local_148._0_8_ = auVar3._0_8_;
  local_128 = auVar5._0_8_;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_158,0x10f,local_168);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_1b8[0] = HAXX::quaternion<double>::real(&local_a8);
    local_1c0 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "S";
    in_stack_fffffffffffff6c0 = (basic_cstring<const_char> *)(local_138 + 8);
    in_stack_fffffffffffff6b8 = "r.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_190,&local_1a0,0x10f,1,8,local_1b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a2736);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1d0,0x110,local_1e0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_220 = HAXX::quaternion<double>::imag_i(&local_a8);
    local_228 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "I";
    in_stack_fffffffffffff6c0 = (basic_cstring<const_char> *)local_138;
    in_stack_fffffffffffff6b8 = "r.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_208,&local_218,0x110,1,8,&local_220);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a28c2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0x111,local_248);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_288 = HAXX::quaternion<double>::imag_j(&local_a8);
    local_290 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "J";
    in_stack_fffffffffffff6c0 = (basic_cstring<const_char> *)(local_148 + 8);
    in_stack_fffffffffffff6b8 = "r.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_270,&local_280,0x111,1,8,&local_288);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a2a4e);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2a0,0x112,local_2b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_2f0 = HAXX::quaternion<double>::imag_k(&local_a8);
    local_2f8 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "K";
    in_stack_fffffffffffff6c0 = (basic_cstring<const_char> *)local_148;
    in_stack_fffffffffffff6b8 = "r.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_2d8,&local_2e8,0x112,1,8,&local_2f0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a2bda);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_308,0x114,local_318);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_360.m_end = (iterator)HAXX::quaternion<double>::real(&local_28);
    local_360.m_begin = (iterator)0x3ff0000000000000;
    local_368 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "1.";
    in_stack_fffffffffffff6c0 = &local_360;
    in_stack_fffffffffffff6b8 = "q.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_340,&local_350,0x114,1,8,&local_360.m_end);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a2d78);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_378,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_378,0x115,local_388);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_3d0.m_end = (iterator)HAXX::quaternion<double>::imag_i(&local_28);
    local_3d0.m_begin = (iterator)0x4000000000000000;
    local_3d8 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "2.";
    in_stack_fffffffffffff6c0 = &local_3d0;
    in_stack_fffffffffffff6b8 = "q.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_3b0,&local_3c0,0x115,1,8,&local_3d0.m_end);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a2f16);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3e8,0x116,local_3f8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_430,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_440.m_end = (iterator)HAXX::quaternion<double>::imag_j(&local_28);
    local_440.m_begin = (iterator)0x4008000000000000;
    local_448 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "3.";
    in_stack_fffffffffffff6c0 = &local_440;
    in_stack_fffffffffffff6b8 = "q.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_420,&local_430,0x116,1,8,&local_440.m_end);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a30b4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_458,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_458,0x117,local_468);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_4b0.m_end = (iterator)HAXX::quaternion<double>::imag_k(&local_28);
    local_4b0.m_begin = (iterator)0x4010000000000000;
    local_4b8 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "4.";
    in_stack_fffffffffffff6c0 = &local_4b0;
    in_stack_fffffffffffff6b8 = "q.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_490,&local_4a0,0x117,1,8,&local_4b0.m_end);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a3252);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4c8,0x119,local_4d8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_510,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_520.m_end = (iterator)HAXX::quaternion<double>::real(&local_68);
    local_520.m_begin = (iterator)0xc014000000000000;
    local_528 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "-5.";
    in_stack_fffffffffffff6c0 = &local_520;
    in_stack_fffffffffffff6b8 = "p.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_500,&local_510,0x119,1,8,&local_520.m_end);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a33f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_538,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_538,0x11a,local_548);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_580,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_590.m_end = (iterator)HAXX::quaternion<double>::imag_i(&local_68);
    local_590.m_begin = (iterator)0x401bc28f5c28f5c3;
    local_598 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "6.94";
    in_stack_fffffffffffff6c0 = &local_590;
    in_stack_fffffffffffff6b8 = "p.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_570,&local_580,0x11a,1,8,&local_590.m_end);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a358e);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    len = 0x60;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5a8,0x11b,local_5b8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5f0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,len);
    local_600.m_end = (iterator)HAXX::quaternion<double>::imag_j(&local_68);
    local_600.m_begin = (iterator)0x401f47ae147ae148;
    local_608 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "7.82";
    in_stack_fffffffffffff6c0 = &local_600;
    in_stack_fffffffffffff6b8 = "p.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_5e0,&local_5f0,0x11b,1,8,&local_600.m_end);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a371a);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_618,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_618,0x11c,local_628);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_660,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_670.m_end = (iterator)HAXX::quaternion<double>::imag_k(&local_68);
    local_670.m_begin = (iterator)0xc020000000000000;
    boost::math::fpc::percent_tolerance<double>((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "-8.";
    in_stack_fffffffffffff6c0 = &local_670;
    in_stack_fffffffffffff6b8 = "p.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_650,&local_660,0x11c,1,8,&local_670.m_end);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a388e);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(quaternion_binary_mul)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.), p(-5.,6.94,7.82,-8.),r;
  r = p * q;

  double A1 = p.real(), A2 = p.imag_i(), A3 = p.imag_j(), A4 = p.imag_k();
  double B1 = q.real(), B2 = q.imag_i(), B3 = q.imag_j(), B4 = q.imag_k();

  double S = A1 * B1 - A2 * B2 - A3 * B3 - A4 * B4;
  double I = A1 * B2 + A2 * B1 + A3 * B4 - A4 * B3;
  double J = A1 * B3 - A2 * B4 + A3 * B1 + A4 * B2;
  double K = A1 * B4 + A2 * B3 - A3 * B2 + A4 * B1;

  BOOST_CHECK_CLOSE(r.real()  ,S, COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_i(),I, COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_j(),J, COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_k(),K, COMPARE_TOL);

  BOOST_CHECK_CLOSE(q.real(),1.  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_i(),2., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_j(),3., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_k(),4., COMPARE_TOL);

  BOOST_CHECK_CLOSE(p.real()  ,-5. , COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_i(),6.94, COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_j(),7.82, COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_k(),-8. , COMPARE_TOL);


}